

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O3

void __thiscall
vkt::texture::anon_unknown_0::Texture3DMaxLevelTestInstance::getReferenceParams
          (Texture3DMaxLevelTestInstance *this,ReferenceParams *params,int cellNdx)

{
  deUint32 dVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (this->super_Texture3DLodControlTestInstance).m_texHeight;
  uVar3 = (this->super_Texture3DLodControlTestInstance).m_texDepth;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (this->super_Texture3DLodControlTestInstance).m_texWidth;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = 0x20;
  if (uVar3 != 0) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar2 = uVar2 ^ 0x1f;
  }
  uVar3 = ((uint)cellNdx >> 0x10 ^ cellNdx ^ 0x3d) * 9;
  uVar3 = (uVar3 >> 4 ^ uVar3) * 0x27d4eb2d;
  dVar1 = deStringHash((this->m_testParam).super_TextureMipmapCommonTestCaseParameters.minFilterName
                      );
  params->maxLevel = (dVar1 ^ uVar3 ^ uVar3 >> 0xf ^ 0x9111e7) % (0x20 - uVar2);
  return;
}

Assistant:

int getMaxLevel (int cellNdx) const
	{
		const int	numLevels	= deLog2Floor32(de::max(m_texWidth, de::max(m_texHeight, m_texDepth)))+1;
		const int	maxLevel	= (deInt32Hash(cellNdx) ^ deStringHash(m_testParam.minFilterName) ^ 0x9111e7) % numLevels;

		return maxLevel;
	}